

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

size_t varint_from_bytes(uchar *bytes,uint64_t *v)

{
  uchar uVar1;
  uint64_t *v_local;
  uchar *bytes_local;
  
  uVar1 = *bytes;
  if (uVar1 == 0xfd) {
    *v = (ulong)*(ushort *)(bytes + 1);
    bytes_local = (uchar *)0x3;
  }
  else if (uVar1 == 0xfe) {
    *v = (ulong)bytes[4] << 0x18 | (ulong)bytes[3] << 0x10 | (ulong)bytes[2] << 8 | (ulong)bytes[1];
    bytes_local = (uchar *)0x5;
  }
  else if (uVar1 == 0xff) {
    *v = (ulong)bytes[8] << 0x38 | (ulong)bytes[7] << 0x30 | (ulong)bytes[6] << 0x28 |
         (ulong)bytes[5] << 0x20 | (ulong)bytes[4] << 0x18 | (ulong)bytes[3] << 0x10 |
         (ulong)bytes[2] << 8 | (ulong)bytes[1];
    bytes_local = (uchar *)0x9;
  }
  else {
    *v = (ulong)*bytes;
    bytes_local = (uchar *)0x1;
  }
  return (size_t)bytes_local;
}

Assistant:

size_t varint_from_bytes(const unsigned char *bytes, uint64_t *v)
{
#define b(n) ((uint64_t)bytes[n] << ((n - 1) * 8))
    switch (*bytes) {
    case VI_TAG_16:
        *v = b(2) | b(1);
        return sizeof(uint8_t) + sizeof(uint16_t);
    case VI_TAG_32:
        *v = b(4) | b(3) | b(2) | b(1);
        return sizeof(uint8_t) + sizeof(uint32_t);
    case VI_TAG_64:
        *v = b(8) | b(7) | b(6) | b(5) | b(4) | b(3) | b(2) | b(1);
        return sizeof(uint8_t) + sizeof(uint64_t);
    }
    *v = *bytes;
    return sizeof(uint8_t);
#undef b
}